

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O3

void new_affect_to_room(ROOM_INDEX_DATA *room,ROOM_AFFECT_DATA *paf)

{
  ROOM_INDEX_DATA *pRVar1;
  ROOM_INDEX_DATA **ppRVar2;
  ROOM_AFFECT_DATA *paf_00;
  ROOM_INDEX_DATA *pRVar3;
  long lVar4;
  ROOM_AFFECT_DATA *pRVar5;
  byte bVar6;
  
  bVar6 = 0;
  if (room->affected == (ROOM_AFFECT_DATA *)0x0) {
    ppRVar2 = &top_affected_room;
    pRVar1 = top_affected_room;
    if (top_affected_room != (ROOM_INDEX_DATA *)0x0) {
      do {
        pRVar3 = pRVar1;
        pRVar1 = pRVar3->aff_next;
      } while (pRVar1 != (ROOM_INDEX_DATA *)0x0);
      ppRVar2 = &pRVar3->aff_next;
    }
    *ppRVar2 = room;
    room->aff_next = (ROOM_INDEX_DATA *)0x0;
  }
  paf_00 = new_affect_room();
  pRVar5 = paf_00;
  for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
    pRVar5->next = paf->next;
    paf = (ROOM_AFFECT_DATA *)((long)paf + (ulong)bVar6 * -0x10 + 8);
    pRVar5 = (ROOM_AFFECT_DATA *)((long)pRVar5 + (ulong)bVar6 * -0x10 + 8);
  }
  paf_00->next = room->affected;
  room->affected = paf_00;
  affect_modify_room(room,paf_00,true);
  return;
}

Assistant:

void new_affect_to_room(ROOM_INDEX_DATA *room, ROOM_AFFECT_DATA *paf)
{
	ROOM_AFFECT_DATA *paf_new;
	ROOM_INDEX_DATA *pRoomIndex;

	if (!room->affected)
	{
		if (top_affected_room)
		{

			for (pRoomIndex = top_affected_room; pRoomIndex->aff_next != nullptr; pRoomIndex = pRoomIndex->aff_next)
			{
				continue;
			}

			pRoomIndex->aff_next = room;
		}
		else
		{
			top_affected_room = room;
		}

		room->aff_next = nullptr;
	}

	paf_new = new_affect_room();

	*paf_new = *paf;
	paf_new->next = room->affected;
	room->affected = paf_new;

	affect_modify_room(room, paf_new, true);
}